

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

uint32_t gen_prep_dbgex(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  uint32_t uVar2;
  TCGTemp *ts;
  
  uVar2 = 0x44;
  if ((ctx->flags & 0x100) != 0) {
    s = ctx->uc->tcg_ctx;
    uVar1 = ctx->singlestep_enabled;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x1498);
    tcg_gen_ori_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)((long)ts - (long)s),
               (ulong)((uVar1 & 1) << 0x1a) + 0x4000000);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x1498);
    tcg_temp_free_internal_ppc64(s,ts);
    uVar2 = 0xf;
  }
  return uVar2;
}

Assistant:

static uint32_t gen_prep_dbgex(DisasContext *ctx)
{
    if (ctx->flags & POWERPC_FLAG_DE) {
        TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
        target_ulong dbsr = 0;
        if (ctx->singlestep_enabled & CPU_SINGLE_STEP) {
            dbsr = DBCR0_ICMP;
        } else {
            /* Must have been branch */
            dbsr = DBCR0_BRT;
        }
        TCGv t0 = tcg_temp_new(tcg_ctx);
        gen_load_spr(tcg_ctx, t0, SPR_BOOKE_DBSR);
        tcg_gen_ori_tl(tcg_ctx, t0, t0, dbsr);
        gen_store_spr(tcg_ctx, SPR_BOOKE_DBSR, t0);
        tcg_temp_free(tcg_ctx, t0);
        return POWERPC_EXCP_DEBUG;
    } else {
        return POWERPC_EXCP_TRACE;
    }
}